

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::RenderWindowDecorations
               (ImGuiWindow *window,ImRect *title_bar_rect,bool title_bar_is_highlight,
               bool handle_borders_and_resize_grips,int resize_grip_count,ImU32 *resize_grip_col,
               float resize_grip_draw_size)

{
  ImVec2 IVar1;
  ImRect *pIVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  ImGuiCol IVar5;
  uint uVar6;
  ImU32 IVar7;
  ImGuiID id;
  ImVec2 *pIVar8;
  ImDrawCornerFlags rounding_corners;
  float fVar9;
  float _x;
  ImRect IVar10;
  ImGuiCol local_21c;
  float local_1fc;
  byte local_1a1;
  ImVec2 local_1a0;
  ImVec2 local_198;
  ImVec2 local_190;
  ImVec2 local_188;
  ImVec2 local_180;
  ImVec2 local_178;
  ImVec2 local_170;
  ImVec2 local_168;
  ImVec2 local_160;
  ImVec2 corner;
  ImGuiResizeGripDef *grip;
  int resize_grip_n;
  ImVec2 local_140;
  ImVec2 local_138;
  ImVec2 local_130;
  ImU32 local_128;
  bool local_122;
  bool local_121;
  ImU32 col;
  bool held;
  bool hovered;
  ImVec2 local_118;
  undefined1 local_110 [8];
  ImRect r;
  ImVec2 p;
  float unhide_sz_hit;
  float unhide_sz_draw;
  ImGuiDockNode *node;
  ImVec2 local_dc;
  ImVec2 local_d4;
  ImVec2 local_cc;
  ImVec2 local_c4;
  ImVec2 local_bc;
  ImRect local_b4;
  undefined1 local_a4 [8];
  ImRect menu_bar_rect;
  ImU32 title_bar_col_1;
  ImVec2 local_88;
  ImVec2 local_80;
  float local_78;
  bool local_71;
  float alpha;
  bool override_alpha;
  ImU32 bg_col;
  bool is_docking_transparent_payload;
  ImVec2 local_60;
  ImU32 local_54;
  float local_50;
  ImU32 title_bar_col;
  float backup_border_size;
  float window_border_size;
  float window_rounding;
  ImGuiWindowFlags flags;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImU32 *pIStack_28;
  float resize_grip_draw_size_local;
  ImU32 *resize_grip_col_local;
  int resize_grip_count_local;
  bool handle_borders_and_resize_grips_local;
  bool title_bar_is_highlight_local;
  ImRect *title_bar_rect_local;
  ImGuiWindow *window_local;
  
  pIVar3 = GImGui;
  style = (ImGuiStyle *)GImGui;
  _window_rounding = &GImGui->Style;
  window_border_size = (float)window->Flags;
  window->SkipItems = false;
  backup_border_size = window->WindowRounding;
  title_bar_col = (ImU32)window->WindowBorderSize;
  g._4_4_ = resize_grip_draw_size;
  pIStack_28 = resize_grip_col;
  resize_grip_col_local._0_4_ = resize_grip_count;
  resize_grip_col_local._6_1_ = handle_borders_and_resize_grips;
  resize_grip_col_local._7_1_ = title_bar_is_highlight;
  _resize_grip_count_local = title_bar_rect;
  title_bar_rect_local = (ImRect *)window;
  if ((window->Collapsed & 1U) == 0) {
    if (((uint)window_border_size & 0x80) == 0) {
      override_alpha = false;
      if (((((pIVar3->DragDropActive & 1U) != 0) &&
           (pIVar3->FrameCount - pIVar3->DragDropAcceptFrameCount < 2)) &&
          (((pIVar3->IO).ConfigDockingTransparentPayload & 1U) != 0)) &&
         ((bVar4 = ImGuiPayload::IsDataType(&pIVar3->DragDropPayload,"_IMWINDOW"), bVar4 &&
          ((ImRect *)**(long **)&style[7].Colors[0x14].z == title_bar_rect_local)))) {
        override_alpha = true;
      }
      IVar5 = GetWindowBgColorIdxFromFlags((ImGuiWindowFlags)window_border_size);
      alpha = (float)GetColorU32(IVar5,1.0);
      if (((uint)title_bar_rect_local[0xb].Min.y & 0x10000) == 0) {
        local_78 = 1.0;
        bVar4 = ((uint)style[6].Colors[0x2b].x & 0x40) != 0;
        if (bVar4) {
          local_78 = style[6].Colors[0x31].x;
        }
        local_71 = (override_alpha & 1U) != 0;
        if (local_71) {
          local_78 = local_78 * 0.5;
        }
        local_71 = local_71 || bVar4;
        if (local_71) {
          uVar6 = (uint)alpha & 0xffffff;
          fVar9 = ImSaturate(local_78);
          alpha = (float)(uVar6 | (int)(fVar9 * 255.0 + 0.5) << 0x18);
        }
      }
      else {
        alpha = (float)((uint)alpha | 0xff000000);
        if ((override_alpha & 1U) != 0) {
          *(float *)((long)title_bar_rect_local[3].Min + 0x84) =
               *(float *)((long)title_bar_rect_local[3].Min + 0x84) * 0.5;
        }
      }
      IVar1 = title_bar_rect_local[0x30].Max;
      pIVar2 = title_bar_rect_local + 4;
      fVar9 = ImGuiWindow::TitleBarHeight((ImGuiWindow *)title_bar_rect_local);
      ImVec2::ImVec2(&local_88,0.0,fVar9);
      local_80 = operator+(&pIVar2->Max,&local_88);
      register0x00001200 = operator+(&title_bar_rect_local[4].Max,&title_bar_rect_local[5].Min);
      rounding_corners = 0xc;
      if (((uint)window_border_size & 1) != 0) {
        rounding_corners = 0xf;
      }
      ImDrawList::AddRectFilled
                ((ImDrawList *)IVar1,&local_80,(ImVec2 *)&menu_bar_rect.Max.y,(ImU32)alpha,
                 backup_border_size,rounding_corners);
    }
    if ((((uint)window_border_size & 1) == 0) &&
       (((uint)title_bar_rect_local[0x48].Min.x & 0x10000) == 0)) {
      IVar5 = 10;
      if ((resize_grip_col_local._7_1_ & 1) != 0) {
        IVar5 = 0xb;
      }
      menu_bar_rect.Max.x = (float)GetColorU32(IVar5,1.0);
      ImDrawList::AddRectFilled
                ((ImDrawList *)title_bar_rect_local[0x30].Max,&_resize_grip_count_local->Min,
                 &_resize_grip_count_local->Max,(ImU32)menu_bar_rect.Max.x,backup_border_size,3);
    }
    if (((uint)window_border_size & 0x400) != 0) {
      IVar10 = ImGuiWindow::MenuBarRect((ImGuiWindow *)title_bar_rect_local);
      menu_bar_rect.Min = IVar10.Max;
      local_a4 = (undefined1  [8])IVar10.Min;
      local_b4 = ImGuiWindow::Rect((ImGuiWindow *)title_bar_rect_local);
      ImRect::ClipWith((ImRect *)local_a4,&local_b4);
      IVar1 = title_bar_rect_local[0x30].Max;
      ImVec2::ImVec2(&local_c4,(float)title_bar_col,0.0);
      local_bc = operator+((ImVec2 *)local_a4,&local_c4);
      ImVec2::ImVec2(&local_d4,(float)title_bar_col,0.0);
      local_cc = ::operator-(&menu_bar_rect.Min,&local_d4);
      IVar7 = GetColorU32(0xd,1.0);
      if (((uint)window_border_size & 1) == 0) {
        local_1fc = 0.0;
      }
      else {
        local_1fc = backup_border_size;
      }
      ImDrawList::AddRectFilled((ImDrawList *)IVar1,&local_bc,&local_cc,IVar7,local_1fc,3);
      if ((0.0 < _window_rounding->FrameBorderSize) &&
         (menu_bar_rect.Min.y < title_bar_rect_local[4].Max.y + title_bar_rect_local[5].Min.y)) {
        IVar1 = title_bar_rect_local[0x30].Max;
        local_dc = ImRect::GetBL((ImRect *)local_a4);
        register0x00001200 = ImRect::GetBR((ImRect *)local_a4);
        IVar7 = GetColorU32(5,1.0);
        ImDrawList::AddLine((ImDrawList *)IVar1,&local_dc,(ImVec2 *)((long)&node + 4),IVar7,
                            _window_rounding->FrameBorderSize);
      }
    }
    IVar1 = title_bar_rect_local[0x45].Max;
    if (((((uint)title_bar_rect_local[0x48].Min.x & 0x10000) != 0) &&
        (bVar4 = ImGuiDockNode::IsHiddenTabBar((ImGuiDockNode *)IVar1), bVar4)) &&
       (bVar4 = ImGuiDockNode::IsNoTabBar((ImGuiDockNode *)IVar1), !bVar4)) {
      fVar9 = ImFloor(style[6].Colors[10].z * 0.7);
      _x = ImFloor(style[6].Colors[10].z * 0.55);
      r.Max = *(ImVec2 *)((long)IVar1 + 0x40);
      ImVec2::ImVec2((ImVec2 *)&col,_x,_x);
      local_118 = operator+(&r.Max,(ImVec2 *)&col);
      ImRect::ImRect((ImRect *)local_110,&r.Max,&local_118);
      id = ImGuiWindow::GetID((ImGuiWindow *)title_bar_rect_local,"#UNHIDE",(char *)0x0);
      bVar4 = ButtonBehavior((ImRect *)local_110,id,&local_121,&local_122,0x80);
      if (bVar4) {
        *(byte *)((long)IVar1 + 0xba) = *(byte *)((long)IVar1 + 0xba) & 0xfb | 4;
      }
      else if (((local_122 & 1U) != 0) && (bVar4 = IsMouseDragging(0,-1.0), bVar4)) {
        StartMouseMovingWindowOrNode
                  ((ImGuiWindow *)title_bar_rect_local,(ImGuiDockNode *)IVar1,true);
      }
      if ((((local_122 & 1U) == 0) || ((local_121 & 1U) == 0)) &&
         (((*(ushort *)((long)IVar1 + 0xb8) >> 10 & 1) == 0 || ((local_121 & 1U) != 0)))) {
        local_21c = 0x15;
        if ((local_121 & 1U) != 0) {
          local_21c = 0x16;
        }
      }
      else {
        local_21c = 0x17;
      }
      local_128 = GetColorU32(local_21c,1.0);
      IVar1 = title_bar_rect_local[0x30].Max;
      ImVec2::ImVec2(&local_138,fVar9,0.0);
      local_130 = operator+(&r.Max,&local_138);
      ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffeb8,0.0,fVar9);
      local_140 = operator+(&r.Max,(ImVec2 *)&stack0xfffffffffffffeb8);
      ImDrawList::AddTriangleFilled((ImDrawList *)IVar1,&r.Max,&local_130,&local_140,local_128);
    }
    if (((uint)title_bar_rect_local[0xb].Min.y & 1) != 0) {
      Scrollbar(ImGuiAxis_X);
    }
    if (((uint)title_bar_rect_local[0xb].Min.y & 0x100) != 0) {
      Scrollbar(ImGuiAxis_Y);
    }
    if (((resize_grip_col_local._6_1_ & 1) != 0) && (((uint)window_border_size & 2) == 0)) {
      for (grip._4_4_ = 0; (int)grip._4_4_ < (int)resize_grip_col_local; grip._4_4_ = grip._4_4_ + 1
          ) {
        corner = (ImVec2)(resize_grip_def + (int)grip._4_4_);
        pIVar2 = title_bar_rect_local + 4;
        local_168 = operator+(&pIVar2->Max,&title_bar_rect_local[5].Min);
        local_160 = ImLerp(&pIVar2->Max,&local_168,(ImVec2 *)corner);
        IVar1 = title_bar_rect_local[0x30].Max;
        pIVar8 = (ImVec2 *)((long)corner + 8);
        if ((grip._4_4_ & 1) == 0) {
          ImVec2::ImVec2(&local_180,g._4_4_,(float)title_bar_col);
        }
        else {
          ImVec2::ImVec2(&local_180,(float)title_bar_col,g._4_4_);
        }
        local_178 = ::operator*(pIVar8,&local_180);
        local_170 = operator+(&local_160,&local_178);
        ImDrawList::PathLineTo((ImDrawList *)IVar1,&local_170);
        IVar1 = title_bar_rect_local[0x30].Max;
        pIVar8 = (ImVec2 *)((long)corner + 8);
        if ((grip._4_4_ & 1) == 0) {
          ImVec2::ImVec2(&local_198,(float)title_bar_col,g._4_4_);
        }
        else {
          ImVec2::ImVec2(&local_198,g._4_4_,(float)title_bar_col);
        }
        local_190 = ::operator*(pIVar8,&local_198);
        local_188 = operator+(&local_160,&local_190);
        ImDrawList::PathLineTo((ImDrawList *)IVar1,&local_188);
        IVar1 = title_bar_rect_local[0x30].Max;
        ImVec2::ImVec2(&local_1a0,
                       *(float *)((long)corner + 8) * (backup_border_size + (float)title_bar_col) +
                       local_160.x,
                       *(float *)((long)corner + 0xc) * (backup_border_size + (float)title_bar_col)
                       + local_160.y);
        ImDrawList::PathArcToFast
                  ((ImDrawList *)IVar1,&local_1a0,backup_border_size,*(int *)((long)corner + 0x10),
                   *(int *)((long)corner + 0x14));
        ImDrawList::PathFillConvex
                  ((ImDrawList *)title_bar_rect_local[0x30].Max,pIStack_28[(int)grip._4_4_]);
      }
    }
    if (((resize_grip_col_local._6_1_ & 1) != 0) && (title_bar_rect_local[0x46].Min == (ImVec2)0x0))
    {
      RenderWindowOuterBorders((ImGuiWindow *)title_bar_rect_local);
    }
  }
  else {
    local_50 = (pIVar3->Style).FrameBorderSize;
    (pIVar3->Style).FrameBorderSize = window->WindowBorderSize;
    local_1a1 = 0;
    if (title_bar_is_highlight) {
      local_1a1 = pIVar3->NavDisableHighlight ^ 0xff;
    }
    local_54 = GetColorU32(0xc - (local_1a1 & 1),1.0);
    local_60 = _resize_grip_count_local->Min;
    _bg_col = _resize_grip_count_local->Max;
    RenderFrame(local_60,_bg_col,local_54,true,backup_border_size);
    style[5].Colors[0xd].w = local_50;
  }
  return;
}

Assistant:

void ImGui::RenderWindowDecorations(ImGuiWindow* window, const ImRect& title_bar_rect, bool title_bar_is_highlight, bool handle_borders_and_resize_grips, int resize_grip_count, const ImU32 resize_grip_col[4], float resize_grip_draw_size)
{
    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;
    ImGuiWindowFlags flags = window->Flags;

    // Ensure that ScrollBar doesn't read last frame's SkipItems
    window->SkipItems = false;

    // Draw window + handle manual resize
    // As we highlight the title bar when want_focus is set, multiple reappearing windows will have have their title bar highlighted on their reappearing frame.
    const float window_rounding = window->WindowRounding;
    const float window_border_size = window->WindowBorderSize;
    if (window->Collapsed)
    {
        // Title bar only
        float backup_border_size = style.FrameBorderSize;
        g.Style.FrameBorderSize = window->WindowBorderSize;
        ImU32 title_bar_col = GetColorU32((title_bar_is_highlight && !g.NavDisableHighlight) ? ImGuiCol_TitleBgActive : ImGuiCol_TitleBgCollapsed);
        RenderFrame(title_bar_rect.Min, title_bar_rect.Max, title_bar_col, true, window_rounding);
        g.Style.FrameBorderSize = backup_border_size;
    }
    else
    {
        // Window background
        if (!(flags & ImGuiWindowFlags_NoBackground))
        {
            bool is_docking_transparent_payload = false;
            if (g.DragDropActive && (g.FrameCount - g.DragDropAcceptFrameCount) <= 1 && g.IO.ConfigDockingTransparentPayload)
                if (g.DragDropPayload.IsDataType(IMGUI_PAYLOAD_TYPE_WINDOW) && *(ImGuiWindow**)g.DragDropPayload.Data == window)
                    is_docking_transparent_payload = true;

            ImU32 bg_col = GetColorU32(GetWindowBgColorIdxFromFlags(flags));
            if (window->ViewportOwned)
            {
                // No alpha
                bg_col = (bg_col | IM_COL32_A_MASK);
                if (is_docking_transparent_payload)
                    window->Viewport->Alpha *= DOCKING_TRANSPARENT_PAYLOAD_ALPHA;
            }
            else
            {
                // Adjust alpha. For docking
                bool override_alpha = false;
                float alpha = 1.0f;
                if (g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasBgAlpha)
                {
                    alpha = g.NextWindowData.BgAlphaVal;
                    override_alpha = true;
                }
                if (is_docking_transparent_payload)
                {
                    alpha *= DOCKING_TRANSPARENT_PAYLOAD_ALPHA; // FIXME-DOCK: Should that be an override?
                    override_alpha = true;
                }
                if (override_alpha)
                    bg_col = (bg_col & ~IM_COL32_A_MASK) | (IM_F32_TO_INT8_SAT(alpha) << IM_COL32_A_SHIFT);
            }
            window->DrawList->AddRectFilled(window->Pos + ImVec2(0, window->TitleBarHeight()), window->Pos + window->Size, bg_col, window_rounding, (flags & ImGuiWindowFlags_NoTitleBar) ? ImDrawCornerFlags_All : ImDrawCornerFlags_Bot);
        }

        // Title bar
        // (when docked, DockNode are drawing their own title bar. Individual windows however do NOT set the _NoTitleBar flag,
        // in order for their pos/size to be matching their undocking state.)
        if (!(flags & ImGuiWindowFlags_NoTitleBar) && !window->DockIsActive)
        {
            ImU32 title_bar_col = GetColorU32(title_bar_is_highlight ? ImGuiCol_TitleBgActive : ImGuiCol_TitleBg);
            window->DrawList->AddRectFilled(title_bar_rect.Min, title_bar_rect.Max, title_bar_col, window_rounding, ImDrawCornerFlags_Top);
        }

        // Menu bar
        if (flags & ImGuiWindowFlags_MenuBar)
        {
            ImRect menu_bar_rect = window->MenuBarRect();
            menu_bar_rect.ClipWith(window->Rect());  // Soft clipping, in particular child window don't have minimum size covering the menu bar so this is useful for them.
            window->DrawList->AddRectFilled(menu_bar_rect.Min + ImVec2(window_border_size, 0), menu_bar_rect.Max - ImVec2(window_border_size, 0), GetColorU32(ImGuiCol_MenuBarBg), (flags & ImGuiWindowFlags_NoTitleBar) ? window_rounding : 0.0f, ImDrawCornerFlags_Top);
            if (style.FrameBorderSize > 0.0f && menu_bar_rect.Max.y < window->Pos.y + window->Size.y)
                window->DrawList->AddLine(menu_bar_rect.GetBL(), menu_bar_rect.GetBR(), GetColorU32(ImGuiCol_Border), style.FrameBorderSize);
        }

        // Docking: Unhide tab bar (small triangle in the corner), drag from small triangle to quickly undock
        ImGuiDockNode* node = window->DockNode;
        if (window->DockIsActive && node->IsHiddenTabBar() && !node->IsNoTabBar())
        {
            float unhide_sz_draw = ImFloor(g.FontSize * 0.70f);
            float unhide_sz_hit = ImFloor(g.FontSize * 0.55f);
            ImVec2 p = node->Pos;
            ImRect r(p, p + ImVec2(unhide_sz_hit, unhide_sz_hit));
            bool hovered, held;
            if (ButtonBehavior(r, window->GetID("#UNHIDE"), &hovered, &held, ImGuiButtonFlags_FlattenChildren))
                node->WantHiddenTabBarToggle = true;
            else if (held && IsMouseDragging(0))
                StartMouseMovingWindowOrNode(window, node, true);

            // FIXME-DOCK: Ideally we'd use ImGuiCol_TitleBgActive/ImGuiCol_TitleBg here, but neither is guaranteed to be visible enough at this sort of size..
            ImU32 col = GetColorU32(((held && hovered) || (node->IsFocused && !hovered)) ? ImGuiCol_ButtonActive : hovered ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
            window->DrawList->AddTriangleFilled(p, p + ImVec2(unhide_sz_draw, 0.0f), p + ImVec2(0.0f, unhide_sz_draw), col);
        }

        // Scrollbars
        if (window->ScrollbarX)
            Scrollbar(ImGuiAxis_X);
        if (window->ScrollbarY)
            Scrollbar(ImGuiAxis_Y);

        // Render resize grips (after their input handling so we don't have a frame of latency)
        if (handle_borders_and_resize_grips && !(flags & ImGuiWindowFlags_NoResize))
        {
            for (int resize_grip_n = 0; resize_grip_n < resize_grip_count; resize_grip_n++)
            {
                const ImGuiResizeGripDef& grip = resize_grip_def[resize_grip_n];
                const ImVec2 corner = ImLerp(window->Pos, window->Pos + window->Size, grip.CornerPosN);
                window->DrawList->PathLineTo(corner + grip.InnerDir * ((resize_grip_n & 1) ? ImVec2(window_border_size, resize_grip_draw_size) : ImVec2(resize_grip_draw_size, window_border_size)));
                window->DrawList->PathLineTo(corner + grip.InnerDir * ((resize_grip_n & 1) ? ImVec2(resize_grip_draw_size, window_border_size) : ImVec2(window_border_size, resize_grip_draw_size)));
                window->DrawList->PathArcToFast(ImVec2(corner.x + grip.InnerDir.x * (window_rounding + window_border_size), corner.y + grip.InnerDir.y * (window_rounding + window_border_size)), window_rounding, grip.AngleMin12, grip.AngleMax12);
                window->DrawList->PathFillConvex(resize_grip_col[resize_grip_n]);
            }
        }

        // Borders (for dock node host they will be rendered over after the tab bar)
        if (handle_borders_and_resize_grips && !window->DockNodeAsHost)
            RenderWindowOuterBorders(window);
    }
}